

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void __thiscall Gc::resumeTheWorld(Gc *this)

{
  int iVar1;
  ulong uVar2;
  
  axl::io::psx::Mapping::protect(&this->m_guardPage,3);
  this->m_handshakeKind = HandshakeKind_ResumeTheWorld;
  this->m_handshakeCounter =
       (int32_t)(this->m_threadArray).
                super_ArrayRef<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_>.m_count;
  if (this->m_handshakeCounter != 0) {
    uVar2 = 0;
    do {
      pthread_kill((this->m_threadArray).
                   super_ArrayRef<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_>.m_p[uVar2],
                   10);
      uVar2 = uVar2 + 1;
    } while (uVar2 < (ulong)(long)this->m_handshakeCounter);
  }
  iVar1 = sem_wait((sem_t *)&this->m_handshakeSem);
  if (iVar1 != 0) {
    axl::err::setLastSystemError();
  }
  this->m_handshakeKind = HandshakeKind_None;
  return;
}

Assistant:

void
	resumeTheWorld() {
		m_guardPage.protect(PROT_READ | PROT_WRITE);

		m_handshakeKind = HandshakeKind_ResumeTheWorld;
		m_handshakeCounter = m_threadArray.getCount();
		for (size_t i = 0; i < m_handshakeCounter; i++)
			pthread_kill((pthread_t)m_threadArray[i], SIGUSR1); // resume

		m_handshakeSem.wait();
		m_handshakeKind = HandshakeKind_None;
	}